

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::init(PartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  bool bVar1;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar2;
  Library *pLVar3;
  EGLConfig pvVar4;
  NotSupportedError *this_01;
  GLES2Renderer *this_02;
  ReferenceRenderer *this_03;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  Library *local_18;
  Library *egl;
  PartialUpdateTest *this_local;
  
  egl = (Library *)this;
  local_18 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar2 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar2;
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar4 = getEGLConfig(pLVar3,this->m_eglDisplay);
  this->m_eglConfig = pvVar4;
  initEGLSurface(this,this->m_eglConfig);
  initEGLContext(this,this->m_eglConfig);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  local_1c = (deUint32)glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,(ApiType)local_1c);
  pLVar3 = local_18;
  pvVar2 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EGL_EXT_buffer_age",&local_41);
  bVar1 = eglu::hasExtension(pLVar3,pvVar2,&local_40);
  this->m_supportBufferAge = bVar1;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pLVar3 = local_18;
  pvVar2 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"EGL_KHR_partial_update",&local_79);
  bVar1 = eglu::hasExtension(pLVar3,pvVar2,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_02 = (GLES2Renderer *)operator_new(0xe0);
    GLES2Renderer::GLES2Renderer(this_02,&this->m_gl);
    this->m_gles2Renderer = this_02;
    this_03 = (ReferenceRenderer *)operator_new(1);
    ReferenceRenderer::ReferenceRenderer(this_03);
    this->m_refRenderer = this_03;
    return (int)this;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"EGL_KHR_partial_update is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
             ,0x181);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void PartialUpdateTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig			= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay);

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_supportBufferAge = eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age");

	if (!eglu::hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}